

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int64_t client_seek_proxy(archive_read_filter *self,int64_t offset,int whence)

{
  archive_read *a;
  archive_seek_callback *UNRECOVERED_JUMPTABLE;
  la_int64_t lVar1;
  
  a = self->archive;
  UNRECOVERED_JUMPTABLE = (a->client).seeker;
  if (UNRECOVERED_JUMPTABLE != (archive_seek_callback *)0x0) {
    lVar1 = (*UNRECOVERED_JUMPTABLE)(&a->archive,self->data,offset,whence);
    return lVar1;
  }
  archive_set_error(&a->archive,-1,"Current client reader does not support seeking a device");
  return -0x19;
}

Assistant:

static int64_t
client_seek_proxy(struct archive_read_filter *self, int64_t offset, int whence)
{
	/* DO NOT use the skipper here!  If we transparently handled
	 * forward seek here by using the skipper, that will break
	 * other libarchive code that assumes a successful forward
	 * seek means it can also seek backwards.
	 */
	if (self->archive->client.seeker == NULL) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Current client reader does not support seeking a device");
		return (ARCHIVE_FAILED);
	}
	return (self->archive->client.seeker)(&self->archive->archive,
	    self->data, offset, whence);
}